

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.cpp
# Opt level: O0

void polyscope::screenshot(bool transparentBG)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  byte in_DIL;
  string defaultName;
  char buff [50];
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [16];
  string *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  string *in_stack_ffffffffffffff70;
  allocator local_59;
  string local_58 [32];
  char local_38 [55];
  byte local_1;
  
  lVar1 = state::screenshotInd;
  local_1 = in_DIL & 1;
  uVar3 = std::__cxx11::string::c_str();
  snprintf(local_38,0x32,"screenshot_%06zu%s",lVar1,uVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,local_38,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff70,(string *)options::screenshotExtension_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,".png",&local_b1);
  bVar2 = anon_unknown_3::hasExtension
                    ((string *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                     in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    local_1 = 0;
  }
  std::__cxx11::string::string(local_d8,local_58);
  screenshot(in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  std::__cxx11::string::~string(local_d8);
  state::screenshotInd = state::screenshotInd + 1;
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void screenshot(bool transparentBG) {

  char buff[50];
  snprintf(buff, 50, "screenshot_%06zu%s", state::screenshotInd, options::screenshotExtension.c_str());
  std::string defaultName(buff);

  // only pngs can be written with transparency
  if (!hasExtension(options::screenshotExtension, ".png")) {
    transparentBG = false;
  }

  screenshot(defaultName, transparentBG);

  state::screenshotInd++;
}